

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaLoader.cpp
# Opt level: O3

void __thiscall
Assimp::ColladaLoader::CollectNodes
          (ColladaLoader *this,aiNode *pNode,
          vector<const_aiNode_*,_std::allocator<const_aiNode_*>_> *poNodes)

{
  pointer *pppaVar1;
  iterator __position;
  ulong uVar2;
  aiNode *local_20;
  
  __position._M_current =
       (poNodes->super__Vector_base<const_aiNode_*,_std::allocator<const_aiNode_*>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  local_20 = pNode;
  if (__position._M_current ==
      (poNodes->super__Vector_base<const_aiNode_*,_std::allocator<const_aiNode_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiNode_const*,std::allocator<aiNode_const*>>::_M_realloc_insert<aiNode_const*const&>
              ((vector<aiNode_const*,std::allocator<aiNode_const*>> *)poNodes,__position,&local_20);
  }
  else {
    *__position._M_current = pNode;
    pppaVar1 = &(poNodes->super__Vector_base<const_aiNode_*,_std::allocator<const_aiNode_*>_>).
                _M_impl.super__Vector_impl_data._M_finish;
    *pppaVar1 = *pppaVar1 + 1;
  }
  if (local_20->mNumChildren != 0) {
    uVar2 = 0;
    do {
      CollectNodes(this,local_20->mChildren[uVar2],poNodes);
      uVar2 = uVar2 + 1;
    } while (uVar2 < local_20->mNumChildren);
  }
  return;
}

Assistant:

void ColladaLoader::CollectNodes(const aiNode* pNode, std::vector<const aiNode*>& poNodes) const
{
    poNodes.push_back(pNode);
    for (size_t a = 0; a < pNode->mNumChildren; ++a) {
        CollectNodes(pNode->mChildren[a], poNodes);
    }
}